

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

int yaml_scalar_event_initialize
              (yaml_event_t *event,yaml_char_t *anchor,yaml_char_t *tag,yaml_char_t *value,
              int length,int plain_implicit,int quoted_implicit,yaml_scalar_style_t style)

{
  int iVar1;
  size_t sVar2;
  yaml_char_t *__ptr;
  yaml_char_t *__ptr_00;
  yaml_tag_directive_t *__dest;
  size_t length_00;
  
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x340,
                  "int yaml_scalar_event_initialize(yaml_event_t *, yaml_char_t *, yaml_char_t *, yaml_char_t *, int, int, int, yaml_scalar_style_t)"
                 );
  }
  if (value == (yaml_char_t *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x341,
                  "int yaml_scalar_event_initialize(yaml_event_t *, yaml_char_t *, yaml_char_t *, yaml_char_t *, int, int, int, yaml_scalar_style_t)"
                 );
  }
  if (anchor == (yaml_char_t *)0x0) {
    __ptr = (yaml_char_t *)0x0;
  }
  else {
    sVar2 = strlen((char *)anchor);
    iVar1 = yaml_check_utf8(anchor,sVar2);
    if (iVar1 == 0) {
      return 0;
    }
    __ptr = (yaml_char_t *)strdup((char *)anchor);
    if (__ptr == (yaml_char_t *)0x0) {
      return 0;
    }
  }
  if (tag == (yaml_char_t *)0x0) {
    __ptr_00 = (yaml_char_t *)0x0;
  }
  else {
    sVar2 = strlen((char *)tag);
    iVar1 = yaml_check_utf8(tag,sVar2);
    if ((iVar1 == 0) ||
       (__ptr_00 = (yaml_char_t *)strdup((char *)tag), __ptr_00 == (yaml_char_t *)0x0)) {
      __ptr_00 = (yaml_char_t *)0x0;
      goto LAB_00103dc9;
    }
  }
  if (length < 0) {
    sVar2 = strlen((char *)value);
    length = (int)sVar2;
  }
  length_00 = (size_t)length;
  iVar1 = yaml_check_utf8(value,length_00);
  if ((iVar1 != 0) &&
     (__dest = (yaml_tag_directive_t *)malloc((long)(int)(length + 1 + (uint)(length == -1))),
     __dest != (yaml_tag_directive_t *)0x0)) {
    memcpy(__dest,value,length_00);
    *(undefined1 *)((long)&__dest->handle + length_00) = 0;
    *(undefined8 *)event = 0;
    (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
    (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
    (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
    (event->data).scalar.length = 0;
    *(undefined8 *)((long)&event->data + 0x20) = 0;
    *(undefined8 *)((long)&event->data + 0x28) = 0;
    event->type = YAML_SCALAR_EVENT;
    (event->end_mark).line = 0;
    (event->end_mark).column = 0;
    (event->start_mark).column = 0;
    (event->end_mark).index = 0;
    (event->start_mark).index = 0;
    (event->start_mark).line = 0;
    (event->data).scalar.anchor = __ptr;
    (event->data).scalar.tag = __ptr_00;
    (event->data).document_start.tag_directives.end = __dest;
    (event->data).scalar.length = length_00;
    (event->data).scalar.plain_implicit = plain_implicit;
    (event->data).scalar.quoted_implicit = quoted_implicit;
    (event->data).scalar.style = style;
    return 1;
  }
LAB_00103dc9:
  if (__ptr != (yaml_char_t *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (yaml_char_t *)0x0) {
    free(__ptr_00);
  }
  return 0;
}

Assistant:

YAML_DECLARE(int)
yaml_scalar_event_initialize(yaml_event_t *event,
        yaml_char_t *anchor, yaml_char_t *tag,
        yaml_char_t *value, int length,
        int plain_implicit, int quoted_implicit,
        yaml_scalar_style_t style)
{
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_char_t *anchor_copy = NULL;
    yaml_char_t *tag_copy = NULL;
    yaml_char_t *value_copy = NULL;

    assert(event);      /* Non-NULL event object is expected. */
    assert(value);      /* Non-NULL anchor is expected. */

    if (anchor) {
        if (!yaml_check_utf8(anchor, strlen((char *)anchor))) goto error;
        anchor_copy = yaml_strdup(anchor);
        if (!anchor_copy) goto error;
    }

    if (tag) {
        if (!yaml_check_utf8(tag, strlen((char *)tag))) goto error;
        tag_copy = yaml_strdup(tag);
        if (!tag_copy) goto error;
    }

    if (length < 0) {
        length = strlen((char *)value);
    }

    if (!yaml_check_utf8(value, length)) goto error;
    value_copy = YAML_MALLOC(length+1);
    if (!value_copy) goto error;
    memcpy(value_copy, value, length);
    value_copy[length] = '\0';

    SCALAR_EVENT_INIT(*event, anchor_copy, tag_copy, value_copy, length,
            plain_implicit, quoted_implicit, style, mark, mark);

    return 1;

error:
    yaml_free(anchor_copy);
    yaml_free(tag_copy);
    yaml_free(value_copy);

    return 0;
}